

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O0

bool __thiscall SQArray::Set(SQArray *this,SQInteger nidx,SQObjectPtr *val)

{
  SQUnsignedInteger SVar1;
  SQObjectPtr *this_00;
  SQObjectPtr *val_local;
  SQInteger nidx_local;
  SQArray *this_local;
  
  if ((-1 < nidx) && (SVar1 = sqvector<SQObjectPtr>::size(&this->_values), nidx < (long)SVar1)) {
    this_00 = sqvector<SQObjectPtr>::operator[](&this->_values,nidx);
    ::SQObjectPtr::operator=(this_00,val);
    return true;
  }
  return false;
}

Assistant:

bool Set(const SQInteger nidx,const SQObjectPtr &val)
    {
        if(nidx>=0 && nidx<(SQInteger)_values.size()){
            _values[nidx]=val;
            return true;
        }
        else return false;
    }